

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_its_file.c
# Opt level: O0

void psa_its_fill_filename(psa_storage_uid_t uid,char *filename)

{
  char *filename_local;
  psa_storage_uid_t uid_local;
  
  snprintf(filename,0x19,"%s%08lx%08lx%s",anon_var_dwarf_16fe6 + 9,uid >> 0x20,uid & 0xffffffff,
           ".psa_its");
  return;
}

Assistant:

static void psa_its_fill_filename( psa_storage_uid_t uid, char *filename )
{
    /* Break up the UID into two 32-bit pieces so as not to rely on
     * long long support in snprintf. */
    mbedtls_snprintf( filename, PSA_ITS_STORAGE_FILENAME_LENGTH,
                      "%s" PSA_ITS_STORAGE_FILENAME_PATTERN "%s",
                      PSA_ITS_STORAGE_PREFIX,
                      (unsigned long) ( uid >> 32 ),
                      (unsigned long) ( uid & 0xffffffff ),
                      PSA_ITS_STORAGE_SUFFIX );
}